

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

string * __thiscall
cfd::core::TapBranch::ToString_abi_cxx11_(string *__return_storage_ptr__,TapBranch *this)

{
  bool bVar1;
  int iVar2;
  HashUtil *pHVar3;
  string *this_00;
  pointer this_01;
  string buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string ver_str;
  string local_150;
  ByteData256 hash;
  string local_118;
  pointer local_f8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  string local_c0;
  HashUtil local_a0;
  ByteData tapbranch_base;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData256 node;
  
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  if (this->has_leaf_ == true) {
    ver_str._M_dataplus._M_p = (pointer)&ver_str.field_2;
    ver_str._M_string_length = 0;
    ver_str.field_2._M_local_buf[0] = '\0';
    if (this->leaf_version_ != 0xc0) {
      ByteData::ByteData((ByteData *)&local_198,this->leaf_version_);
      ByteData::GetHex_abi_cxx11_(&local_150,(ByteData *)&local_198);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a0,",",&local_150);
      ::std::__cxx11::string::operator=((string *)&ver_str,(string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_198);
    }
    Script::GetHex_abi_cxx11_(&local_118,&this->script_);
    ::std::operator+(&local_198,"tl(",&local_118);
    ::std::operator+(&local_150,&local_198,&ver_str);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                     &local_150,")");
    ::std::__cxx11::string::operator=((string *)&buf,(string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string((string *)&local_198);
    ::std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    if ((this->branch_list_).
        super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->branch_list_).
        super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar1 = ByteData256::IsEmpty(&this->root_commitment_);
      if (bVar1) {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&ver_str);
        goto LAB_0039ccd6;
      }
    }
    ByteData256::GetHex_abi_cxx11_(&ver_str,&this->root_commitment_);
    ::std::__cxx11::string::operator=((string *)&buf,(string *)&ver_str);
  }
  ::std::__cxx11::string::~string((string *)&ver_str);
  if ((this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buf._M_dataplus._M_p == &buf.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buf.field_2._M_allocated_capacity._1_7_,buf.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = buf.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = buf._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buf.field_2._M_allocated_capacity._1_7_,buf.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = buf._M_string_length;
    buf._M_string_length = 0;
    buf.field_2._M_local_buf[0] = '\0';
    buf._M_dataplus._M_p = (pointer)&buf.field_2;
  }
  else {
    GetBaseHash(&hash,this);
    if (ToString[abi:cxx11]()::kTaggedHash == '\0') {
      iVar2 = __cxa_guard_acquire(&ToString[abi:cxx11]()::kTaggedHash);
      if (iVar2 != 0) {
        ::std::__cxx11::string::string((string *)&ver_str,"TapBranch",(allocator *)&local_a0);
        HashUtil::Sha256(&ToString::kTaggedHash,(string *)&ver_str);
        ::std::__cxx11::string::~string((string *)&ver_str);
        __cxa_atexit(ByteData256::~ByteData256,&ToString::kTaggedHash,&__dso_handle);
        __cxa_guard_release(&ToString[abi:cxx11]()::kTaggedHash);
      }
    }
    ByteData256::Concat<cfd::core::ByteData256>
              (&tapbranch_base,&ToString::kTaggedHash,&ToString::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&nodes,this);
    local_f8 = (this->branch_list_).
               super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (this->branch_list_).
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_01 != local_f8;
        this_01 = this_01 + 1) {
      HashUtil::HashUtil(&local_a0,'\x03');
      pHVar3 = HashUtil::operator<<(&local_a0,&tapbranch_base);
      HashUtil::HashUtil((HashUtil *)&ver_str,pHVar3);
      HashUtil::~HashUtil(&local_a0);
      GetCurrentBranchHash(&node,this_01);
      ByteData256::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,&node);
      ByteData256::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,&hash);
      bVar1 = ::std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                        (local_f0._M_impl.super__Vector_impl_data._M_start,
                         local_f0._M_impl.super__Vector_impl_data._M_finish,
                         local_d8._M_impl.super__Vector_impl_data._M_start,
                         local_d8._M_impl.super__Vector_impl_data._M_finish);
      if (bVar1) {
        pHVar3 = HashUtil::operator<<((HashUtil *)&ver_str,&hash);
        pHVar3 = HashUtil::operator<<(pHVar3,&node);
        HashUtil::Output256((ByteData256 *)&local_a0,pHVar3);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&hash.data_,&local_a0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
        ::std::operator+(&local_118,"{",&buf);
        ::std::operator+(&local_198,&local_118,",");
        ToString_abi_cxx11_(&local_c0,this_01);
        ::std::operator+(&local_150,&local_198,&local_c0);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a0,&local_150,"}");
        ::std::__cxx11::string::operator=((string *)&buf,(string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::__cxx11::string::~string((string *)&local_c0);
        ::std::__cxx11::string::~string((string *)&local_198);
        this_00 = &local_118;
      }
      else {
        pHVar3 = HashUtil::operator<<((HashUtil *)&ver_str,&node);
        pHVar3 = HashUtil::operator<<(pHVar3,&hash);
        HashUtil::Output256((ByteData256 *)&local_a0,pHVar3);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&hash.data_,&local_a0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
        ToString_abi_cxx11_(&local_c0,this_01);
        ::std::operator+(&local_118,"{",&local_c0);
        ::std::operator+(&local_198,&local_118,",");
        ::std::operator+(&local_150,&local_198,&buf);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a0,&local_150,"}");
        ::std::__cxx11::string::operator=((string *)&buf,(string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::__cxx11::string::~string((string *)&local_198);
        ::std::__cxx11::string::~string((string *)&local_118);
        this_00 = &local_c0;
      }
      ::std::__cxx11::string::~string((string *)this_00);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
      HashUtil::~HashUtil((HashUtil *)&ver_str);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buf._M_dataplus._M_p == &buf.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buf.field_2._M_allocated_capacity._1_7_,buf.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = buf.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = buf._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buf.field_2._M_allocated_capacity._1_7_,buf.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = buf._M_string_length;
    buf._M_string_length = 0;
    buf.field_2._M_local_buf[0] = '\0';
    buf._M_dataplus._M_p = (pointer)&buf.field_2;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tapbranch_base);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
  }
LAB_0039ccd6:
  ::std::__cxx11::string::~string((string *)&buf);
  return __return_storage_ptr__;
}

Assistant:

std::string TapBranch::ToString() const {
  std::string buf;
  if (has_leaf_) {
    std::string ver_str;
    if (leaf_version_ != TaprootScriptTree::kTapScriptLeafVersion) {
      ver_str = "," + ByteData(leaf_version_).GetHex();
    }
    buf = "tl(" + script_.GetHex() + ver_str + ")";
  } else if (branch_list_.empty() && root_commitment_.IsEmpty()) {
    return "";
  } else {
    buf = root_commitment_.GetHex();
  }
  if (branch_list_.empty()) return buf;

  ByteData256 hash = GetBaseHash();
  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  for (const auto& branch : branch_list_) {
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto node = branch.GetCurrentBranchHash();
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
      buf = "{" + buf + "," + branch.ToString() + "}";
    } else {
      hash = (hasher << node << hash).Output256();
      buf = "{" + branch.ToString() + "," + buf + "}";
    }
  }
  return buf;
}